

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dos-disk.c
# Opt level: O3

void dos_drop_disk_imp(hd_context *ctx,dos_disk *disk)

{
  hd_error_stack_slot *phVar1;
  int iVar2;
  
  iVar2 = hd_push_try(ctx);
  if (iVar2 != 0) {
    iVar2 = __sigsetjmp(ctx->error->top->buffer,0);
    if (iVar2 == 0) {
      if (disk->first_sector != (uchar *)0x0) {
        hd_free(ctx,disk->first_sector);
      }
      iVar2 = (disk->super).dev_fd;
      if (-1 < iVar2) {
        close(iVar2);
        (disk->super).dev_fd = 0;
      }
    }
  }
  phVar1 = ctx->error->top;
  ctx->error->top = phVar1 + -1;
  if (phVar1->code < 2) {
    return;
  }
  hd_rethrow(ctx);
}

Assistant:

static void
dos_drop_disk_imp(hd_context *ctx, dos_disk *disk)
{
    hd_try(ctx)
    {
        if (disk->first_sector != NULL)
            hd_free(ctx, disk->first_sector);

        SAFE_DEV_CLOSE(disk->super.dev_fd);
    }
    hd_catch(ctx)
        hd_rethrow(ctx);
}